

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::BitwiseXor
                  (BitwiseXorForm4 bitwiseXor,Image *in1,uint32_t startX1,uint32_t startY1,
                  Image *in2,uint32_t startX2,uint32_t startY2,uint32_t width,uint32_t height)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 in_ECX;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  Image *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  Image *out;
  uint32_t in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  ImageTemplate<unsigned_char> *pIVar3;
  Image *this;
  uint32_t in_stack_ffffffffffffff88;
  
  this = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff70,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c
             ,in_stack_ffffffffffffff58,(uint32_t)in_RDI,in_stack_ffffffffffffff88);
  pIVar3 = in_RDX;
  PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_00000020,in_stack_00000018),
             (uint32_t)((ulong)pIVar3 >> 0x20),(uint32_t)pIVar3,(uint8_t)((ulong)in_RDI >> 0x38),
             (uint8_t)((ulong)in_RDI >> 0x30));
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(this);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(this);
  (*in_RSI)(in_RDX,in_ECX,in_R8D,in_R9,in_stack_00000008,in_stack_00000010,this,0,0,uVar1,uVar2);
  return in_RDI;
}

Assistant:

Image BitwiseXor( FunctionTable::BitwiseXorForm4 bitwiseXor,
                      const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                      uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, width, height );

        Image out = in1.generate( width, height, in1.colorCount() );

        bitwiseXor( in1, startX1, startY1, in2, startX2, startY2, out, 0, 0, out.width(), out.height() );

        return out;
    }